

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedma_cache.c
# Opt level: O3

ent * get_ent(state *s,int i)

{
  int iVar1;
  _Bool _Var2;
  int iVar3;
  uint uVar4;
  ent *peVar5;
  uint uVar6;
  
  iVar3 = (s->cache).i0;
  if (i < iVar3) {
    return (ent *)0x0;
  }
  iVar1 = (s->cache).i1;
  if (iVar1 < i) {
LAB_00103121:
    peVar5 = (ent *)0x0;
  }
  else {
    if (iVar1 == i) {
      _Var2 = (*(s->op).parse)(s);
      if (!_Var2) goto LAB_00103121;
      iVar3 = (s->cache).i0;
    }
    iVar1 = (s->cache).k;
    uVar6 = (i - iVar3) + iVar1;
    uVar4 = (i - iVar3) + 0xfff + iVar1;
    if (-1 < (int)uVar6) {
      uVar4 = uVar6;
    }
    peVar5 = (s->cache).ent + (int)(uVar6 - (uVar4 & 0xfffff000));
  }
  return peVar5;
}

Assistant:

struct ent *
get_ent(struct state *s, int i)
{
	struct cache *c = &s->cache;

	if (i < c->i0 || i > c->i1)
		return NULL;

	if (i == c->i1 && !s->op.parse(s))
		return NULL;

	return CACHE_ENT(s, i);
}